

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes(Impl *this)

{
  ExecutionModel EVar1;
  bool bVar2;
  Impl *this_local;
  
  EVar1 = this->execution_model;
  if (EVar1 == ExecutionModelTessellationControl) {
    bVar2 = emit_execution_modes_hull(this);
    if (!bVar2) {
      return false;
    }
  }
  else if (EVar1 == ExecutionModelTessellationEvaluation) {
    bVar2 = emit_execution_modes_domain(this);
    if (!bVar2) {
      return false;
    }
  }
  else if (EVar1 == ExecutionModelGeometry) {
    bVar2 = emit_execution_modes_geometry(this);
    if (!bVar2) {
      return false;
    }
  }
  else if (EVar1 == ExecutionModelFragment) {
    bVar2 = emit_execution_modes_pixel(this);
    if (!bVar2) {
      return false;
    }
  }
  else if (EVar1 == ExecutionModelGLCompute) {
    if ((this->execution_model_lib_target & 1U) == 0) {
      bVar2 = emit_execution_modes_compute(this);
      if (!bVar2) {
        return false;
      }
    }
    else {
      bVar2 = emit_execution_modes_node(this);
      if (!bVar2) {
        return false;
      }
    }
  }
  else if (EVar1 - ExecutionModelRayGenerationKHR < 6) {
    bVar2 = emit_execution_modes_ray_tracing(this,this->execution_model);
    if (!bVar2) {
      return false;
    }
  }
  else if (EVar1 == ExecutionModelTaskEXT) {
    bVar2 = emit_execution_modes_amplification(this);
    if (!bVar2) {
      return false;
    }
  }
  else if ((EVar1 == ExecutionModelMeshEXT) && (bVar2 = emit_execution_modes_mesh(this), !bVar2)) {
    return false;
  }
  bVar2 = emit_execution_modes_fp_denorm(this);
  return bVar2;
}

Assistant:

bool Converter::Impl::emit_execution_modes()
{
	switch (execution_model)
	{
	case spv::ExecutionModelGLCompute:
		if (execution_model_lib_target)
		{
			if (!emit_execution_modes_node())
				return false;
		}
		else
		{
			if (!emit_execution_modes_compute())
				return false;
		}
		break;

	case spv::ExecutionModelGeometry:
		if (!emit_execution_modes_geometry())
			return false;
		break;

	case spv::ExecutionModelTessellationControl:
		if (!emit_execution_modes_hull())
			return false;
		break;

	case spv::ExecutionModelTessellationEvaluation:
		if (!emit_execution_modes_domain())
			return false;
		break;

	case spv::ExecutionModelFragment:
		if (!emit_execution_modes_pixel())
			return false;
		break;

	case spv::ExecutionModelRayGenerationKHR:
	case spv::ExecutionModelMissKHR:
	case spv::ExecutionModelIntersectionKHR:
	case spv::ExecutionModelAnyHitKHR:
	case spv::ExecutionModelCallableKHR:
	case spv::ExecutionModelClosestHitKHR:
		if (!emit_execution_modes_ray_tracing(execution_model))
			return false;
		break;

	case spv::ExecutionModelTaskEXT:
		if (!emit_execution_modes_amplification())
			return false;
		break;

	case spv::ExecutionModelMeshEXT:
		if (!emit_execution_modes_mesh())
			return false;
		break;

	default:
		break;
	}

	if (!emit_execution_modes_fp_denorm())
		return false;

	return true;
}